

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::WriteFormatInfo(JSONWriter *out)

{
  allocator local_31;
  string local_30;
  
  JSONWriter::StartObj(out,false);
  std::__cxx11::string::string((string *)&local_30,"format",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  JSONWriter::SimpleValue<char[14]>(out,(char (*) [14])"\"assimp2json\"");
  std::__cxx11::string::string((string *)&local_30,"version",&local_31);
  JSONWriter::Key(out,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  local_30._M_dataplus._M_p._0_4_ = 100;
  JSONWriter::SimpleValue<int>(out,(int *)&local_30);
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void WriteFormatInfo(JSONWriter& out) {
    out.StartObj();
    out.Key("format");
    out.SimpleValue("\"assimp2json\"");
    out.Key("version");
    out.SimpleValue(CURRENT_FORMAT_VERSION);
    out.EndObj();
}